

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

size_t pbrt::GetCurrentRSS(void)

{
  int iVar1;
  FILE *__stream;
  long rss;
  
  __stream = fopen("/proc/self/statm","r");
  if (__stream == (FILE *)0x0) {
    if (LOGGING_LogLevel < 2) {
      Log(Error,
          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/memory.cpp"
          ,0x93,"Unable to open /proc/self/statm");
    }
  }
  else {
    iVar1 = __isoc99_fscanf(__stream,"%*s%ld");
    if (iVar1 == 1) {
      fclose(__stream);
      sysconf(0x1e);
    }
    else {
      if (LOGGING_LogLevel < 2) {
        Log(Error,
            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/memory.cpp"
            ,0x99,"Unable to read /proc/self/statm");
      }
      fclose(__stream);
    }
  }
  return 0;
}

Assistant:

size_t GetCurrentRSS() {
#ifdef PBRT_IS_WINDOWS
    PROCESS_MEMORY_COUNTERS info;
    GetProcessMemoryInfo(GetCurrentProcess(), &info, sizeof(info));
    return (size_t)info.WorkingSetSize;
#elif defined(PBRT_IS_OSX)
    struct mach_task_basic_info info;
    mach_msg_type_number_t infoCount = MACH_TASK_BASIC_INFO_COUNT;
    if (task_info(mach_task_self(), MACH_TASK_BASIC_INFO, (task_info_t)&info,
                  &infoCount) != KERN_SUCCESS)
        return (size_t)0L; /* Can't access? */
    return (size_t)info.resident_size;

#elif defined(PBRT_IS_LINUX)
    FILE *fp;
    if ((fp = fopen("/proc/self/statm", "r")) == nullptr) {
        LOG_ERROR("Unable to open /proc/self/statm");
        return 0;
    }

    long rss = 0L;
    if (fscanf(fp, "%*s%ld", &rss) != 1) {
        LOG_ERROR("Unable to read /proc/self/statm");
        fclose(fp);
        return 0;
    }
    fclose(fp);
    return (size_t)rss * (size_t)sysconf(_SC_PAGESIZE);
#elif defined(PBRT_IS_GPU_CODE)
    return 0;
#else
#error "TODO: implement GetCurrentRSS() for this target"
    return 0;
    /*    struct rusage rusage;
    CHECK(getrusage(RUSAGE_SELF, &rusage) == 0);
    return rusage.ru_idrss;
    */
#endif
}